

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::GetIssuanceBlindingKeyRequest,cfd::js::api::json::BlindingKeyResponse,cfd::js::api::GetIssuanceBlindingKeyRequestStruct,cfd::js::api::BlindingKeyResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetIssuanceBlindingKeyRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_520;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_468 [4];
  JsonClassBase<cfd::js::api::json::BlindingKeyResponse> local_448 [4];
  undefined1 local_428 [8];
  BlindingKeyResponse res_2;
  undefined1 local_3c8 [8];
  BlindingKeyResponseStruct response;
  GetIssuanceBlindingKeyRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_a0 [8];
  GetIssuanceBlindingKeyRequest req;
  function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetIssuanceBlindingKeyRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._120_8_ = call_function;
  GetIssuanceBlindingKeyRequest::GetIssuanceBlindingKeyRequest
            ((GetIssuanceBlindingKeyRequest *)local_a0);
  core::JsonClassBase<cfd::js::api::json::GetIssuanceBlindingKeyRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::GetIssuanceBlindingKeyRequest> *)local_a0,
             request_message);
  GetIssuanceBlindingKeyRequest::ConvertToStruct
            ((GetIssuanceBlindingKeyRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (GetIssuanceBlindingKeyRequest *)local_a0);
  std::
  function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetIssuanceBlindingKeyRequestStruct_&)>
  ::operator()((BlindingKeyResponseStruct *)local_3c8,call_function,
               (GetIssuanceBlindingKeyRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    BlindingKeyResponse::BlindingKeyResponse((BlindingKeyResponse *)local_428);
    BlindingKeyResponse::ConvertFromStruct
              ((BlindingKeyResponse *)local_428,(BlindingKeyResponseStruct *)local_3c8);
    core::JsonClassBase<cfd::js::api::json::BlindingKeyResponse>::Serialize_abi_cxx11_(local_448);
    std::__cxx11::string::operator=((string *)this,(string *)local_448);
    std::__cxx11::string::~string((string *)local_448);
    BlindingKeyResponse::~BlindingKeyResponse((BlindingKeyResponse *)local_428);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_520,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_468);
    std::__cxx11::string::operator=((string *)this,(string *)local_468);
    std::__cxx11::string::~string((string *)local_468);
    ErrorResponse::~ErrorResponse(&local_520);
  }
  res_2._87_1_ = 1;
  BlindingKeyResponseStruct::~BlindingKeyResponseStruct((BlindingKeyResponseStruct *)local_3c8);
  GetIssuanceBlindingKeyRequestStruct::~GetIssuanceBlindingKeyRequestStruct
            ((GetIssuanceBlindingKeyRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  GetIssuanceBlindingKeyRequest::~GetIssuanceBlindingKeyRequest
            ((GetIssuanceBlindingKeyRequest *)local_a0);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}